

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComponent.cpp
# Opt level: O2

void __thiscall
RemoveVCProcessTest_testMeshComponentsRemoveB_Test::
RemoveVCProcessTest_testMeshComponentsRemoveB_Test
          (RemoveVCProcessTest_testMeshComponentsRemoveB_Test *this)

{
  RemoveVCProcessTest::RemoveVCProcessTest(&this->super_RemoveVCProcessTest);
  (this->super_RemoveVCProcessTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_007f23a8;
  return;
}

Assistant:

TEST_F(RemoveVCProcessTest, testMeshComponentsRemoveB)
{
    piProcess->SetDeleteFlags(aiComponent_TEXCOORDSn(1) | aiComponent_NORMALS);
    piProcess->Execute(pScene);

    EXPECT_TRUE(pScene->mMeshes[0]->mTextureCoords[0] &&
        pScene->mMeshes[0]->mTextureCoords[1]  &&
        pScene->mMeshes[0]->mTextureCoords[2]  &&     // shift forward ...
        !pScene->mMeshes[0]->mTextureCoords[3] &&
        !pScene->mMeshes[0]->mNormals);
    EXPECT_EQ(0U, pScene->mFlags);
}